

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::rrb_details::push_down_tail<int,false,6>
          (rrb_details *this,ref<immutable::rrb<int,_false,_6>_> *in,
          ref<immutable::rrb<int,_false,_6>_> *new_rrb,
          ref<immutable::rrb_details::leaf_node<int,_false>_> *new_tail)

{
  uint32_t *puVar1;
  rrb<int,_false,_6> *prVar2;
  rrb_size_table<false> *prVar3;
  tree_node<int,_false> *ptVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  ref<immutable::rrb<int,_false,_6>_> *prVar8;
  ref<immutable::rrb<int,_false,_6>_> *prVar9;
  ref<immutable::rrb_details::internal_node<int,_false>_> *to_set;
  ref<immutable::rrb_details::internal_node<int,false>> *prVar10;
  internal_node<int,_false> *piVar11;
  char *__function;
  uint32_t uVar12;
  uint32_t k;
  uint uVar13;
  uint uVar14;
  uint32_t uVar15;
  uint uVar16;
  uint32_t empty_height;
  bool bVar17;
  ref<immutable::rrb_details::tree_node<int,_false>_> temp;
  ref<immutable::rrb_details::leaf_node<int,_false>_> old_tail;
  ref<immutable::rrb_details::internal_node<int,_false>_> current;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_60;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_58;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_50;
  rrb<int,_false,_6> *local_48;
  ref<immutable::rrb<int,_false,_6>_> *local_40;
  ref<immutable::rrb<int,_false,_6>_> *local_38;
  
  prVar2 = new_rrb->ptr;
  if (prVar2 != (rrb<int,_false,_6> *)0x0) {
    local_58.ptr = (prVar2->tail).ptr;
    if (local_58.ptr != (leaf_node<int,_false> *)0x0) {
      (local_58.ptr)->_ref_count = (local_58.ptr)->_ref_count + 1;
    }
    ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(&prVar2->tail,new_tail);
    prVar2 = in->ptr;
    if (prVar2 != (rrb<int,_false,_6> *)0x0) {
      piVar11 = (internal_node<int,_false> *)(prVar2->root).ptr;
      if (piVar11 != (internal_node<int,_false> *)0x0) {
        uVar15 = prVar2->cnt;
        piVar11->_ref_count = piVar11->_ref_count + 1;
        uVar13 = uVar15 - 1;
        uVar15 = prVar2->shift;
        uVar12 = 0;
        k = 0;
        empty_height = 0;
        local_50.ptr = piVar11;
        local_48 = (rrb<int,_false,_6> *)this;
        local_40 = in;
        local_38 = new_rrb;
        do {
          if (uVar15 < 7) {
            if (uVar15 == 0) {
              uVar15 = 0;
              goto LAB_00149746;
            }
            if (local_50.ptr != (internal_node<int,_false> *)0x0) {
              empty_height = empty_height + 1;
              k = uVar12;
              if ((local_50.ptr)->len < 0x40) {
                k = empty_height;
              }
              goto LAB_00149746;
            }
LAB_0014994f:
            __function = 
            "T *immutable::ref<immutable::rrb_details::internal_node<int, false>>::operator->() const [T = immutable::rrb_details::internal_node<int, false>]"
            ;
            goto LAB_0014997b;
          }
          if (local_50.ptr == (internal_node<int,_false> *)0x0) goto LAB_0014994f;
          prVar3 = ((local_50.ptr)->size_table).ptr;
          uVar14 = uVar13;
          if (prVar3 == (rrb_size_table<false> *)0x0) {
            bVar7 = (byte)uVar15;
            bVar6 = bVar7 + 6 & 0x1f;
            bVar17 = uVar13 >> bVar6 == 0;
            if (bVar17) {
              in = (ref<immutable::rrb<int,_false,_6>_> *)(ulong)(uVar13 >> (bVar7 & 0x1f) & 0x3f);
              uVar14 = uVar13 & ~(0x3f << (bVar7 & 0x1f));
            }
            else {
              empty_height = empty_height + 1;
            }
            bVar17 = !bVar17;
            uVar16 = uVar13 >> bVar6;
            uVar13 = uVar14;
            if (uVar16 == 0) goto LAB_0014964e;
          }
          else {
            uVar16 = (local_50.ptr)->len - 1;
            in = (ref<immutable::rrb<int,_false,_6>_> *)(ulong)uVar16;
            if (uVar16 == 0) {
              in = (ref<immutable::rrb<int,_false,_6>_> *)0x0;
            }
            else {
              uVar14 = uVar13 - prVar3->size[(local_50.ptr)->len - 2];
            }
LAB_0014964e:
            empty_height = empty_height + 1;
            if ((uint)in < 0x3f) {
              k = empty_height;
              uVar12 = empty_height;
            }
            if ((uint)in < (local_50.ptr)->len) {
              ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                        (&local_50,(local_50.ptr)->child + ((ulong)in & 0xffffffff));
            }
            else {
              local_60.ptr = (internal_node<int,_false> *)0x0;
              ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                        (&local_50,&local_60);
              release<int>(local_60.ptr);
            }
            uVar13 = uVar14;
            if (local_50.ptr == (internal_node<int,_false> *)0x0) {
              bVar17 = true;
              k = empty_height;
              uVar12 = empty_height;
            }
            else {
              uVar15 = uVar15 - 6;
              bVar17 = false;
            }
          }
        } while (!bVar17);
        this = (rrb_details *)local_48;
        if (bVar17) {
LAB_00149746:
          prVar9 = local_38;
          this = (rrb_details *)local_48;
          if (6 < uVar15) {
            empty_height = empty_height + (uVar15 - 7) / 6 + 1;
          }
          if (k == 0) {
            piVar11 = (internal_node<int,_false> *)malloc(0x30);
            prVar8 = local_40;
            piVar11->type = INTERNAL_NODE;
            piVar11->len = 2;
            (piVar11->size_table).ptr = (rrb_size_table<false> *)0x0;
            piVar11->child =
                 (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar11 + 1);
            piVar11[1].type = LEAF_NODE;
            piVar11[1].len = 0;
            piVar11[1]._ref_count = 0;
            piVar11[1].guid = 0;
            piVar11->_ref_count = 1;
            piVar11->guid = 0;
            if (local_40->ptr != (rrb<int,_false,_6> *)0x0) {
              ref<immutable::rrb_details::internal_node<int,false>>::operator=
                        ((ref<immutable::rrb_details::internal_node<int,false>> *)piVar11->child,
                         &local_40->ptr->root);
              prVar2 = prVar9->ptr;
              if (prVar2 != (rrb<int,_false,_6> *)0x0) {
                piVar11->_ref_count = piVar11->_ref_count + 1;
                local_60.ptr = (internal_node<int,_false> *)(prVar2->root).ptr;
                (prVar2->root).ptr = (tree_node<int,_false> *)piVar11;
                ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                          ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_60);
                if (prVar9->ptr != (rrb<int,_false,_6> *)0x0) {
                  puVar1 = &prVar9->ptr->shift;
                  *puVar1 = *puVar1 + 6;
                  prVar2 = prVar8->ptr;
                  if (prVar2 != (rrb<int,_false,_6> *)0x0) {
                    ptVar4 = (prVar2->root).ptr;
                    if (ptVar4 == (tree_node<int,_false> *)0x0) {
                      __function = 
                      "T *immutable::ref<immutable::rrb_details::tree_node<int, false>>::operator->() const [T = immutable::rrb_details::tree_node<int, false>]"
                      ;
                      goto LAB_0014997b;
                    }
                    if ((ptVar4->type != LEAF_NODE) &&
                       (lVar5._0_4_ = ptVar4[1].type, lVar5._4_4_ = ptVar4[1].len, lVar5 != 0)) {
                      local_60.ptr = (internal_node<int,_false> *)malloc(0x18);
                      *(ref<immutable::rrb_details::rrb_size_table<false>_> **)local_60.ptr =
                           &(local_60.ptr)->size_table;
                      (local_60.ptr)->guid = 0;
                      (local_60.ptr)->_ref_count = 1;
                      if (local_58.ptr == (leaf_node<int,_false> *)0x0) goto LAB_00149985;
                      *(uint32_t *)&((local_60.ptr)->size_table).ptr =
                           prVar2->cnt - (local_58.ptr)->len;
                      *(uint32_t *)((long)&((local_60.ptr)->size_table).ptr + 4) = prVar2->cnt;
                      ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                                (&piVar11->size_table,
                                 (ref<immutable::rrb_details::rrb_size_table<false>_> *)&local_60);
                      if ((local_60.ptr != (internal_node<int,_false> *)0x0) &&
                         (uVar15 = (local_60.ptr)->_ref_count,
                         (local_60.ptr)->_ref_count = uVar15 - 1, uVar15 == 1)) {
                        free(local_60.ptr);
                      }
                    }
                    if (prVar9->ptr != (rrb<int,_false,_6> *)0x0) {
                      prVar10 = (ref<immutable::rrb_details::internal_node<int,false>> *)
                                append_empty<int,false>
                                          ((ref<immutable::rrb_details::internal_node<int,_false>_>
                                            *)(*(long *)&(prVar9->ptr->root).ptr[1]._ref_count + 8),
                                           empty_height);
                      ref<immutable::rrb_details::internal_node<int,false>>::operator=
                                (prVar10,&local_58);
                      release<int>(piVar11);
                      goto LAB_00149906;
                    }
                  }
                }
              }
            }
            goto LAB_00149966;
          }
          if (local_58.ptr == (leaf_node<int,_false> *)0x0) {
LAB_00149985:
            __function = 
            "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
            ;
            goto LAB_0014997b;
          }
          to_set = copy_first_k<int,false,6>(local_40,local_38,k,(local_58.ptr)->len);
          prVar10 = (ref<immutable::rrb_details::internal_node<int,false>> *)
                    append_empty<int,false>(to_set,empty_height - k);
          ref<immutable::rrb_details::internal_node<int,false>>::operator=(prVar10,&local_58);
LAB_00149906:
          prVar2 = prVar9->ptr;
          *(rrb<int,_false,_6> **)this = prVar2;
          if (prVar2 != (rrb<int,_false,_6> *)0x0) {
            prVar2->_ref_count = prVar2->_ref_count + 1;
          }
        }
        release<int>(local_50.ptr);
LAB_00149920:
        if ((local_58.ptr != (leaf_node<int,_false> *)0x0) &&
           (uVar15 = (local_58.ptr)->_ref_count, (local_58.ptr)->_ref_count = uVar15 - 1,
           uVar15 == 1)) {
          free(local_58.ptr);
        }
        return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
      }
      prVar2 = new_rrb->ptr;
      if (prVar2 != (rrb<int,_false,_6> *)0x0) {
        prVar2->shift = 0;
        if (local_58.ptr != (leaf_node<int,_false> *)0x0) {
          (local_58.ptr)->_ref_count = (local_58.ptr)->_ref_count + 1;
        }
        local_60.ptr = (internal_node<int,_false> *)(prVar2->root).ptr;
        (prVar2->root).ptr = (tree_node<int,_false> *)local_58.ptr;
        ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                  ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_60);
        prVar2 = new_rrb->ptr;
        *(rrb<int,_false,_6> **)this = prVar2;
        if (prVar2 != (rrb<int,_false,_6> *)0x0) {
          prVar2->_ref_count = prVar2->_ref_count + 1;
        }
        goto LAB_00149920;
      }
    }
  }
LAB_00149966:
  __function = 
  "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
  ;
LAB_0014997b:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> push_down_tail(const ref<rrb<T, atomic_ref_counting, N>>& in, const ref<rrb<T, atomic_ref_counting, N>>& new_rrb, const ref<leaf_node<T, atomic_ref_counting>>& new_tail)
      {
      ref<leaf_node<T, atomic_ref_counting>> old_tail = new_rrb->tail;
      new_rrb->tail = new_tail;
      //if (in->cnt <= bits<N>::rrb_branching)
      if (in->root.ptr == nullptr) // [JanM] old code is commented out above. Fixed this due to bug, see unit test test_bug_concat in vector_tests.cpp
        {
        new_rrb->shift = 0;
        new_rrb->root = old_tail;
        return new_rrb;
        }

      // Copyable count starts here

      // TODO: Can find last rightmost jump in constant time for pvec subvecs:
      // use the fact that (index & large_mask) == 1 << (RRB_BITS * H) - 1 -> 0 etc.

      uint32_t index = in->cnt - 1;

      uint32_t nodes_to_copy = 0;
      uint32_t nodes_visited = 0;
      uint32_t pos = 0; // pos is the position we insert empty nodes in the bottom
                        // copyable node (or the element, if we can copy the leaf)
      ref<internal_node<T, atomic_ref_counting>> current = in->root;
      uint32_t shift = in->shift;

      // checking all non-leaf nodes (or if tail, all but the lowest two levels)
      while (shift > bits<N>::rrb_bits)
        {
        // calculate child index
        uint32_t child_index;
        if (current->size_table.ptr == nullptr)
          {
          // some check here to ensure we're not overflowing the pvec subvec.
          // important to realise that this only needs to be done once in a better
          // impl, the same way the size_table check only has to be done until it's
          // false.
          const uint32_t prev_shift = shift + bits<N>::rrb_bits;
          if (index >> prev_shift > 0)
            {
            nodes_visited++; // this could possibly be done earlier in the code.
            goto copyable_count_end;
            }
          child_index = (index >> shift) & bits<N>::rrb_mask;
          // index filtering is not necessary when the check above is performed at
          // most once.
          index &= ~(bits<N>::rrb_mask << shift);
          }
        else
          {
          // no need for sized_pos here, luckily.
          child_index = current->len - 1;
          // Decrement index
          if (child_index != 0)
            {
            index -= current->size_table->size[child_index - 1];
            }
          }
        nodes_visited++;
        if (child_index < bits<N>::rrb_mask)
          {
          nodes_to_copy = nodes_visited;
          pos = child_index;
          }

        if (child_index < current->len)
          current = current->child[child_index];
        else
          current = ref<internal_node<T, atomic_ref_counting>>();
        // This will only happen in a pvec subtree
        if (current.ptr == nullptr)
          {
          nodes_to_copy = nodes_visited;
          pos = child_index;

          // if next element we're looking at is null, we can copy all above. Good
          // times.
          goto copyable_count_end;
          }
        shift -= bits<N>::rrb_bits;
        }
      // if we're here, we're at the leaf node (or lowest non-leaf), which is
      // `current`

      // no need to even use index here: We know it'll be placed at current->len,
      // if there's enough space. That check is easy.
      if (shift != 0)
        {
        nodes_visited++;
        if (current->len < bits<N>::rrb_branching)
          {
          nodes_to_copy = nodes_visited;
          pos = current->len;
          }
        }

    copyable_count_end:
      // GURRHH, nodes_visited is not yet handled nicely. for loop down to get
      // nodes_visited set straight.
      while (shift > bits<N>::rrb_bits)
        {
        nodes_visited++;
        shift -= bits<N>::rrb_bits;
        }

      // Increasing height of tree.
      if (nodes_to_copy == 0)
        {
        ref<internal_node<T, atomic_ref_counting>> new_root = internal_node_create<T, atomic_ref_counting>(2);
        new_root->child[0] = in->root;
        new_rrb->root = new_root;
        new_rrb->shift = new_rrb->shift + bits<N>::rrb_bits;

        // create size table if the original rrb root has a size table.
        if (in->root->type != LEAF_NODE && ((const internal_node<T, atomic_ref_counting> *)in->root.ptr)->size_table.ptr != nullptr)
          {
          ref<rrb_size_table<atomic_ref_counting>> table = size_table_create<atomic_ref_counting>(2);
          table->size[0] = in->cnt - old_tail->len;
          // If we insert the tail, the old size minus the old tail size will be the
          // amount of elements in the left branch. If there is no tail, the size is
          // just the old rrb-tree.

          table->size[1] = in->cnt;
          // If we insert the tail, the old size would include the tail.
          // Consequently, it has to be the old size. If we have no tail, we append
          // a single element to the old vector, therefore it has to be one more
          // than the original.

          new_root->size_table = table;
          }

        // nodes visited == original rrb tree height. Nodes visited > 0.
        ref<internal_node<T, atomic_ref_counting>>* to_set = append_empty(&((internal_node<T, atomic_ref_counting> *)new_rrb->root.ptr)->child[1], nodes_visited);
        *to_set = old_tail;
        }
      else
        {
        ref<internal_node<T, atomic_ref_counting>>* node = copy_first_k(in, new_rrb, nodes_to_copy, old_tail->len);
        ref<internal_node<T, atomic_ref_counting>>* to_set = append_empty(node, nodes_visited - nodes_to_copy);
        *to_set = old_tail;
        }
      return new_rrb;
      }